

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int string_buffer_write8(StringBuffer *s,uint8_t *p,int len)

{
  int iVar1;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int i;
  int local_20;
  int local_4;
  
  if ((*(int *)(in_RDI + 0x14) < *(int *)(in_RDI + 0x10) + in_EDX) &&
     (iVar1 = string_buffer_realloc((StringBuffer *)CONCAT44(len,i),unaff_retaddr_00,unaff_retaddr),
     iVar1 != 0)) {
    local_4 = -1;
  }
  else {
    if (*(int *)(in_RDI + 0x18) == 0) {
      memcpy((void *)(*(long *)(in_RDI + 8) + 0x10 + (long)*(int *)(in_RDI + 0x10)),in_RSI,
             (long)in_EDX);
      *(int *)(in_RDI + 0x10) = in_EDX + *(int *)(in_RDI + 0x10);
    }
    else {
      for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
        *(ushort *)(*(long *)(in_RDI + 8) + 0x10 + (long)(*(int *)(in_RDI + 0x10) + local_20) * 2) =
             (ushort)*(byte *)((long)in_RSI + (long)local_20);
      }
      *(int *)(in_RDI + 0x10) = in_EDX + *(int *)(in_RDI + 0x10);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int string_buffer_write8(StringBuffer *s, const uint8_t *p, int len)
{
    int i;

    if (s->len + len > s->size) {
        if (string_buffer_realloc(s, s->len + len, 0))
            return -1;
    }
    if (s->is_wide_char) {
        for (i = 0; i < len; i++) {
            s->str->u.str16[s->len + i] = p[i];
        }
        s->len += len;
    } else {
        memcpy(&s->str->u.str8[s->len], p, len);
        s->len += len;
    }
    return 0;
}